

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,double *_value)

{
  bool _swap;
  ostream *this_00;
  void *this_01;
  double local_30;
  float64_t tmp;
  double *_value_local;
  istream *_in_local;
  _PLYReader_ *p_Stack_10;
  ValueType _type_local;
  _PLYReader_ *this_local;
  
  tmp = (float64_t)_value;
  _value_local = (double *)_in;
  _in_local._4_4_ = _type;
  p_Stack_10 = this;
  if (_type == ValueTypeFLOAT64 || _type == ValueTypeDOUBLE) {
    _swap = Options::check(&this->options_,2);
    restore<double>(_in,&local_30,_swap);
    *(double *)tmp = local_30;
  }
  else {
    *_value = 0.0;
    this_00 = std::operator<<((ostream *)&std::cerr,"unsupported conversion type to double: ");
    this_01 = (void *)std::ostream::operator<<(this_00,_in_local._4_4_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, double& _value) const {

    switch (_type) {

        case ValueTypeFLOAT64:

        case ValueTypeDOUBLE:

            float64_t tmp;
            restore(_in, tmp, options_.check(Options::MSB));
            _value = tmp;

            break;

    default:

        _value = 0.0;
        std::cerr << "unsupported conversion type to double: " << _type << std::endl;

        break;
    }
}